

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_twin_messenger.c
# Opt level: O2

void twin_messenger_do_work(TWIN_MESSENGER_HANDLE twin_msgr_handle)

{
  TWIN_OPERATION_TYPE TVar1;
  int iVar2;
  LOGGER_LOG p_Var3;
  TWIN_OPERATION_CONTEXT *twin_op_ctx;
  TWIN_OPERATION_TYPE TVar4;
  char *pcVar5;
  TWIN_OPERATION_TYPE TVar6;
  char *pcVar7;
  time_t local_28;
  
  if (twin_msgr_handle == (TWIN_MESSENGER_HANDLE)0x0) {
    return;
  }
  if (twin_msgr_handle->state != TWIN_MESSENGER_STATE_STARTED) goto LAB_00139dfe;
  singlylinkedlist_remove_if
            (twin_msgr_handle->pending_patches,send_pending_twin_patch,twin_msgr_handle);
  if (twin_msgr_handle->subscription_error_count < 3) {
    TVar1 = twin_msgr_handle->subscription_state;
    TVar4 = TVar1;
    if (TVar1 == TWIN_OPERATION_TYPE_GET) {
      TVar6 = TWIN_OPERATION_TYPE_GET_ON_DEMAND;
    }
    else if (TVar1 == (TWIN_OPERATION_TYPE_PUT|TWIN_OPERATION_TYPE_GET_ON_DEMAND)) {
      TVar6 = 8;
      TVar4 = TWIN_OPERATION_TYPE_PUT;
    }
    else {
      if (TVar1 != TWIN_OPERATION_TYPE_PUT) goto LAB_00139dfe;
      TVar6 = TWIN_OPERATION_TYPE_DELETE;
    }
    if (TVar6 == TVar1) goto LAB_00139dfe;
    twin_op_ctx = create_twin_operation_context(twin_msgr_handle,TVar4);
    if (twin_op_ctx == (TWIN_OPERATION_CONTEXT *)0x0) {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        pcVar5 = "Failed creating a context for TWIN request (%s, %s)";
        iVar2 = 0x4b8;
        pcVar7 = TWIN_OPERATION_TYPEStringStorage[TVar4];
        goto LAB_00139c94;
      }
    }
    else {
      iVar2 = add_twin_operation_context_to_queue(twin_op_ctx);
      if (iVar2 == 0) {
        iVar2 = send_twin_operation_request(twin_msgr_handle,twin_op_ctx,(CONSTBUFFER_HANDLE)0x0);
        if (iVar2 == 0) {
          twin_msgr_handle->subscription_state = TVar6;
          goto LAB_00139dfe;
        }
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                    ,"process_twin_subscription",0x4c5,1,"Failed sending TWIN request (%s, %s)",
                    twin_msgr_handle->device_id,TWIN_OPERATION_TYPEStringStorage[TVar4]);
        }
        remove_twin_operation_context_from_queue(twin_op_ctx);
      }
      else {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                    ,"process_twin_subscription",0x4bf,1,
                    "Failed queueing TWIN request context (%s, %s)",twin_msgr_handle->device_id,
                    TWIN_OPERATION_TYPEStringStorage[TVar4]);
        }
      }
      destroy_twin_operation_context(twin_op_ctx);
    }
  }
  else {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      pcVar5 = "Maximum number of TWIN subscription-related failures reached (%s, %lu)";
      iVar2 = 0x49a;
      pcVar7 = (char *)twin_msgr_handle->subscription_error_count;
LAB_00139c94:
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                ,"process_twin_subscription",iVar2,1,pcVar5,twin_msgr_handle->device_id,pcVar7);
    }
  }
  update_state(twin_msgr_handle,TWIN_MESSENGER_STATE_ERROR);
LAB_00139dfe:
  local_28 = get_time((time_t *)0x0);
  if (local_28 == -1) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                ,"process_timeouts",0x44c,1,"Failed obtaining current time (%s)",
                twin_msgr_handle->device_id);
    }
    update_state(twin_msgr_handle,TWIN_MESSENGER_STATE_ERROR);
  }
  else {
    singlylinkedlist_remove_if
              (twin_msgr_handle->pending_patches,remove_expired_twin_patch_request,&local_28);
    singlylinkedlist_remove_if
              (twin_msgr_handle->operations,remove_expired_twin_operation_request,&local_28);
  }
  amqp_messenger_do_work(twin_msgr_handle->amqp_msgr);
  return;
}

Assistant:

void twin_messenger_do_work(TWIN_MESSENGER_HANDLE twin_msgr_handle)
{
    if (twin_msgr_handle != NULL)
    {
        TWIN_MESSENGER_INSTANCE* twin_msgr = (TWIN_MESSENGER_INSTANCE*)twin_msgr_handle;

        if (twin_msgr->state == TWIN_MESSENGER_STATE_STARTED)
        {
            (void)singlylinkedlist_remove_if(twin_msgr->pending_patches, send_pending_twin_patch, (const void*)twin_msgr);

            process_twin_subscription(twin_msgr);
        }

        process_timeouts(twin_msgr);

        amqp_messenger_do_work(twin_msgr->amqp_msgr);
    }
}